

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O2

void CMU462::Misc::init_mesh(void)

{
  int iVar1;
  uint *puVar2;
  int iVar3;
  double *pdVar4;
  int i_1;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  int j;
  long lVar8;
  int i;
  long lVar9;
  double *pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double __x;
  double dVar14;
  
  pdVar4 = Vertices + 7;
  for (lVar9 = 0; lVar9 != 0x51; lVar9 = lVar9 + 1) {
    dVar13 = (double)(int)lVar9 / 80.0;
    __x = dVar13 * 3.141592653589793;
    pdVar10 = pdVar4;
    for (lVar8 = 0; lVar8 != 0x65; lVar8 = lVar8 + 1) {
      dVar14 = (double)(int)lVar8 / 100.0;
      pdVar10[-7] = dVar14;
      pdVar10[-6] = 1.0 - dVar13;
      dVar14 = dVar14 * 6.283185307179586;
      dVar11 = sin(__x);
      dVar12 = sin(dVar14);
      pdVar10[-2] = dVar12 * dVar11;
      pdVar10[-5] = dVar12 * dVar11;
      dVar12 = cos(__x);
      pdVar10[-1] = dVar12;
      pdVar10[-4] = dVar12;
      dVar12 = cos(dVar14);
      *pdVar10 = dVar12 * dVar11;
      pdVar10[-3] = dVar12 * dVar11;
      pdVar10 = pdVar10 + 8;
    }
    pdVar4 = pdVar4 + 0x328;
  }
  puVar2 = Indices + 5;
  iVar3 = 0;
  for (lVar9 = 0; puVar5 = puVar2, lVar8 = -100, lVar9 != 0x50; lVar9 = lVar9 + 1) {
    for (; lVar8 != 0; lVar8 = lVar8 + 1) {
      iVar1 = (int)lVar8;
      uVar6 = iVar3 + iVar1 + 100;
      puVar5[-5] = uVar6;
      puVar5[-4] = iVar3 + 0xc9 + iVar1;
      uVar7 = iVar3 + 0xca + iVar1;
      puVar5[-3] = uVar7;
      puVar5[-2] = uVar7;
      puVar5[-1] = iVar3 + iVar1 + 0x65;
      *puVar5 = uVar6;
      puVar5 = puVar5 + 6;
    }
    puVar2 = puVar2 + 600;
    iVar3 = iVar3 + 0x65;
  }
  return;
}

Assistant:

void init_mesh() {
  for ( int i = 0; i <= SPHERE_NUM_LAT; i++ ) {
    for ( int j = 0; j <= SPHERE_NUM_LON; j++ ) {
      double lat = ((double)i) / SPHERE_NUM_LAT;
      double lon = ((double)j) / SPHERE_NUM_LON;
      double *vptr = &Vertices[VERTEX_SIZE * SINDEX(i,j)];

      vptr[TCOORD_OFFSET + 0] = lon;
      vptr[TCOORD_OFFSET + 1] = 1-lat;

      lat *= PI;
      lon *= 2 * PI;
      double sinlat = sin( lat );

      vptr[NORMAL_OFFSET + 0] = vptr[VERTEX_OFFSET + 0] = sinlat * sin(lon);
      vptr[NORMAL_OFFSET + 1] = vptr[VERTEX_OFFSET + 1] = cos(lat),
      vptr[NORMAL_OFFSET + 2] = vptr[VERTEX_OFFSET + 2] = sinlat * cos(lon);
    }
  }

  for ( int i = 0; i < SPHERE_NUM_LAT; i++ ) {
    for ( int j = 0; j < SPHERE_NUM_LON; j++ ) {
      unsigned int* iptr = &Indices[6 * ( SPHERE_NUM_LON * i + j )];

      unsigned int i00 = SINDEX(i,  j  );
      unsigned int i10 = SINDEX(i+1,j  );
      unsigned int i11 = SINDEX(i+1,j+1);
      unsigned int i01 = SINDEX(i,  j+1);

      iptr[0] = i00;
      iptr[1] = i10;
      iptr[2] = i11;
      iptr[3] = i11;
      iptr[4] = i01;
      iptr[5] = i00;
    }
  }
}